

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void continuous_dist_test_icdf<trng::lognormal_dist<long_double>>(lognormal_dist<long_double> *d)

{
  undefined1 x [16];
  undefined1 x_00 [16];
  pointer plVar1;
  longdouble lVar2;
  int i;
  int iVar3;
  BinaryExpr<const_long_double_&,_const_long_double_&> *this;
  pointer plVar4;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble lVar6;
  longdouble in_ST4;
  longdouble lVar7;
  longdouble in_ST5;
  longdouble lVar8;
  undefined6 in_stack_fffffffffffffec2;
  vector<long_double,_std::allocator<long_double>_> p_values;
  SourceLineInfo local_f8;
  SourceLineInfo *local_e0;
  longdouble local_d4;
  StringRef local_c8;
  longdouble local_b8;
  AssertionHandler catchAssertionHandler;
  BinaryExpr<const_long_double_&,_const_long_double_&> local_60;
  
  local_d4 = (longdouble)2.7755576e-17;
  p_values.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_values.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  p_values.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  catchAssertionHandler.m_assertionInfo.macroName._0_10_ = (BADTYPE)0.5;
  local_b8 = local_d4;
  std::vector<long_double,_std::allocator<long_double>_>::emplace_back<long_double>
            (&p_values,(longdouble *)&catchAssertionHandler);
  for (iVar3 = 2; iVar3 != 0x40; iVar3 = iVar3 + 1) {
    lVar6 = in_ST4;
    in_ST5 = in_ST4;
    powl();
    catchAssertionHandler.m_assertionInfo.macroName._0_10_ = (longdouble)0 + in_ST0;
    std::vector<long_double,_std::allocator<long_double>_>::emplace_back<long_double>
              (&p_values,(longdouble *)&catchAssertionHandler);
    in_ST0 = in_ST2;
    in_ST2 = in_ST4;
    in_ST4 = in_ST5;
    powl();
    catchAssertionHandler.m_assertionInfo.macroName._0_10_ = (longdouble)1 - in_ST1;
    std::vector<long_double,_std::allocator<long_double>_>::emplace_back<long_double>
              (&p_values,(longdouble *)&catchAssertionHandler);
    in_ST1 = in_ST3;
    in_ST3 = lVar6;
  }
  this = (BinaryExpr<const_long_double_&,_const_long_double_&> *)
         p_values.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
         super__Vector_impl_data._M_finish;
  std::
  __sort<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (p_values.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start);
  plVar1 = p_values.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (plVar4 = p_values.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                super__Vector_impl_data._M_start; plVar4 != plVar1; plVar4 = plVar4 + 1) {
    lVar6 = *plVar4;
    x._10_6_ = in_stack_fffffffffffffec2;
    x._0_10_ = lVar6;
    lVar7 = in_ST5;
    lVar8 = in_ST5;
    trng::lognormal_dist<long_double>::icdf
              ((result_type_conflict3 *)d,(lognormal_dist<long_double> *)this,
               (result_type_conflict3)x);
    x_00._10_6_ = in_stack_fffffffffffffec2;
    x_00._0_10_ = in_ST0;
    trng::lognormal_dist<long_double>::cdf
              ((result_type_conflict3 *)d,(lognormal_dist<long_double> *)this,
               (result_type_conflict3)x_00);
    lVar5 = ABS(in_ST1 - lVar6);
    in_ST0 = in_ST2;
    in_ST1 = in_ST3;
    lVar6 = in_ST4;
    lVar2 = in_ST5;
    if (local_d4 <= lVar5) {
      local_60.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x2602f7;
      local_60.super_ITransientExpression.m_isBinaryExpression = true;
      local_60.super_ITransientExpression.m_result = false;
      local_60.super_ITransientExpression._10_6_ = 0;
      local_f8.file =
           "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
      ;
      local_f8.line._0_2_ = 0xa8;
      local_f8.line._2_6_ = 0;
      Catch::StringRef::StringRef(&local_c8,"std::abs(y - p) < eps");
      Catch::AssertionHandler::AssertionHandler
                (&catchAssertionHandler,(StringRef *)&local_60,&local_f8,local_c8,Normal);
      local_f8.file = SUB108(lVar5,0);
      local_f8.line._0_2_ = (undefined2)((unkuint10)lVar5 >> 0x40);
      local_e0 = &local_f8;
      Catch::ExprLhs<long_double_const&>::operator<
                (&local_60,(ExprLhs<long_double_const&> *)&local_e0,&local_b8);
      this = &local_60;
      Catch::AssertionHandler::handleExpr
                (&catchAssertionHandler,&local_60.super_ITransientExpression);
      Catch::ITransientExpression::~ITransientExpression(&local_60.super_ITransientExpression);
      Catch::AssertionHandler::complete(&catchAssertionHandler);
      Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
      in_ST0 = in_ST2;
      in_ST1 = in_ST3;
      lVar6 = in_ST4;
      lVar2 = in_ST5;
    }
    in_ST5 = lVar8;
    in_ST4 = lVar7;
    in_ST3 = lVar2;
    in_ST2 = lVar6;
  }
  std::_Vector_base<long_double,_std::allocator<long_double>_>::~_Vector_base
            (&p_values.super__Vector_base<long_double,_std::allocator<long_double>_>);
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}